

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O0

int CVmFormatter::wtoi(wchar_t *p)

{
  undefined8 uVar1;
  int iVar2;
  wchar_t *in_RDI;
  bool bVar3;
  int neg;
  long acc;
  int local_10;
  wchar_t *local_8;
  
  uVar1 = _local_10;
  bVar3 = false;
  local_8 = in_RDI;
  while (iVar2 = t3_is_whitespace((wchar_t)((ulong)uVar1 >> 0x20)), iVar2 != 0) {
    local_8 = local_8 + 1;
  }
  if (*local_8 == L'+') {
    local_8 = local_8 + 1;
  }
  else {
    bVar3 = *local_8 == L'-';
    if (bVar3) {
      local_8 = local_8 + 1;
    }
  }
  local_10 = 0;
  while (iVar2 = is_digit(L'\0'), iVar2 != 0) {
    iVar2 = value_of_digit(*local_8);
    local_10 = iVar2 + local_10 * 10;
    local_8 = local_8 + 1;
  }
  if (bVar3) {
    local_10 = -local_10;
  }
  return local_10;
}

Assistant:

int CVmFormatter::wtoi(const wchar_t *p)
{
    long acc;
    int neg = FALSE;

    /* skip any leading whitespace */
    while (t3_is_whitespace(*p))
        ++p;

    /* check for a leading sign */
    if (*p == '+')
    {
        /* positive sign - skip it */
        ++p;
    }
    else if (*p == '-')
    {
        /* negative sign - note it and skip it */
        neg = TRUE;
        ++p;
    }

    /* scan the digits */
    for (acc = 0 ; is_digit(*p) ; ++p)
    {
        /* shift the accumulator and add this digit */
        acc *= 10;
        acc += value_of_digit(*p);
    }

    /* apply the sign */
    if (neg)
        acc = -acc;

    /* return the result */
    return acc;
}